

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkfile_p.cpp
# Opt level: O3

int __thiscall QNetworkFile::qt_metacall(QNetworkFile *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  undefined8 *puVar1;
  undefined4 in_register_00000014;
  
  _id_00 = QFile::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id_00 < 5) {
      if (_id_00 == 2) {
        puVar1 = (undefined8 *)*_a;
        if (*_a[1] == 0) {
          *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
          goto LAB_0018c37f;
        }
      }
      else {
        puVar1 = (undefined8 *)*_a;
      }
      *puVar1 = 0;
    }
  }
  else {
    if (_c != InvokeMetaMethod) {
      return _id_00;
    }
    if (_id_00 < 5) {
      qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
    }
  }
LAB_0018c37f:
  return _id_00 - 5;
}

Assistant:

int QNetworkFile::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QFile::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    return _id;
}